

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O1

int send_telemetry_with_device_client
              (BACK_COMPAT_HANDLE handle,DEVICE_CREATION_TYPE create_type,
              MESSAGE_CREATION_MECHANISM msg_type,IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  _Bool _Var1;
  IOTHUB_CLIENT_RESULT IVar2;
  IOTHUBMESSAGE_CONTENT_TYPE IVar3;
  IOTHUB_MESSAGE_RESULT IVar4;
  IOTHUB_DEVICE_CLIENT_LL_HANDLE iotHubClientHandle;
  LOGGER_LOG p_Var5;
  int iVar6;
  size_t timeout_seconds;
  int iVar7;
  char *pcVar8;
  IOTHUB_MESSAGE_HANDLE unaff_R15;
  BACK_COMPAT_MSG_CTX bc_msg_ctx;
  uchar *buffer;
  undefined2 local_3c;
  undefined1 local_3a;
  uchar *local_38;
  size_t local_30;
  
  local_3a = 0;
  local_3c = 0;
  iotHubClientHandle = create_device_client(handle,create_type,protocol);
  if (iotHubClientHandle == (IOTHUB_DEVICE_CLIENT_LL_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return 0;
    }
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
              ,"send_telemetry_with_device_client",0x268,1,"Failure creating davice client");
    return 0;
  }
  IVar2 = IoTHubDeviceClient_LL_SetConnectionStatusCallback
                    (iotHubClientHandle,connection_status_callback,&local_3c);
  if (IVar2 == IOTHUB_CLIENT_OK) {
    if (msg_type == TEST_MESSAGE_CREATE_STRING) {
      unaff_R15 = IoTHubMessage_CreateFromString("back_compat_message_string");
    }
    else if (msg_type == TEST_MESSAGE_CREATE_BYTE_ARRAY) {
      unaff_R15 = IoTHubMessage_CreateFromByteArray("\x03\v\f",3);
    }
    if (unaff_R15 == (IOTHUB_MESSAGE_HANDLE)0x0) {
      p_Var5 = xlogging_get_log_function();
      iVar7 = 0x1f7;
      if (p_Var5 != (LOGGER_LOG)0x0) {
        pcVar8 = "Failure creating Iothub message";
        iVar6 = 0x1f6;
LAB_0011b2a2:
        iVar7 = 0x1f7;
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                  ,"send_telemetry_message",iVar6,1,pcVar8);
      }
    }
    else {
      IVar3 = IoTHubMessage_GetContentType(unaff_R15);
      iVar7 = 0;
      if (IVar3 == IOTHUBMESSAGE_STRING) {
        pcVar8 = IoTHubMessage_GetString(unaff_R15);
        if (pcVar8 == (char *)0x0) {
          p_Var5 = xlogging_get_log_function();
          iVar7 = 0x20e;
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar8 = "Failure Getting string from iothub message";
            iVar6 = 0x20d;
LAB_0011b19c:
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                      ,"send_telemetry_message",iVar6,1,pcVar8);
          }
        }
      }
      else if (IVar3 == IOTHUBMESSAGE_BYTEARRAY) {
        IVar4 = IoTHubMessage_GetByteArray(unaff_R15,&local_38,&local_30);
        if (IVar4 == IOTHUB_MESSAGE_OK) {
          iVar7 = 0;
        }
        else {
          p_Var5 = xlogging_get_log_function();
          iVar7 = 0x205;
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar8 = "Failure Getting byte array from iothub message";
            iVar6 = 0x204;
            goto LAB_0011b19c;
          }
        }
      }
      IoTHubMessage_SetMessageId(unaff_R15,"MSG_ID");
      IoTHubMessage_GetMessageId(unaff_R15);
      IoTHubMessage_SetCorrelationId(unaff_R15,"CORE_ID");
      IoTHubMessage_GetCorrelationId(unaff_R15);
      IoTHubMessage_SetContentTypeSystemProperty(unaff_R15,"application%2fjson");
      IoTHubMessage_GetContentTypeSystemProperty(unaff_R15);
      IoTHubMessage_SetContentEncodingSystemProperty(unaff_R15,"utf-8");
      IoTHubMessage_GetContentEncodingSystemProperty(unaff_R15);
      IoTHubMessage_SetOutputName(unaff_R15,"output_name");
      IoTHubMessage_GetOutputName(unaff_R15);
      IoTHubMessage_SetInputName(unaff_R15,"input_name");
      IoTHubMessage_GetInputName(unaff_R15);
      IoTHubMessage_SetProperty(unaff_R15,"property_key","property_value");
      IoTHubMessage_GetProperty(unaff_R15,"property_key");
      IVar2 = IoTHubDeviceClient_LL_SendEventAsync
                        (iotHubClientHandle,unaff_R15,message_recv_callback,&local_3c);
      if (IVar2 != IOTHUB_CLIENT_OK) {
        p_Var5 = xlogging_get_log_function();
        iVar7 = 0x1f7;
        if (p_Var5 != (LOGGER_LOG)0x0) {
          pcVar8 = "Failure calling send event async";
          iVar6 = 0x22b;
          goto LAB_0011b2a2;
        }
      }
    }
    if (iVar7 == 0) {
      tickcounter_get_current_ms(handle->tick_cntr_handle,(tickcounter_ms_t *)&local_38);
      do {
        IoTHubDeviceClient_LL_DoWork(iotHubClientHandle);
        if ((char)local_3c != '\0') break;
        _Var1 = is_operation_timed_out
                          (handle->tick_cntr_handle,(tickcounter_ms_t)local_38,timeout_seconds);
      } while (!_Var1);
      goto LAB_0011b2e5;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0011b2e5;
    pcVar8 = "Failure sending telemetry message";
    iVar7 = 0x274;
  }
  else {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0011b2e5;
    pcVar8 = "Failure setting connection status callback";
    iVar7 = 0x26f;
  }
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
            ,"send_telemetry_with_device_client",iVar7,1,pcVar8);
LAB_0011b2e5:
  IoTHubDeviceClient_LL_Destroy(iotHubClientHandle);
  if (handle->transport_handle != (TRANSPORT_HANDLE)0x0) {
    IoTHubTransport_Destroy(handle->transport_handle);
  }
  return 0;
}

Assistant:

int send_telemetry_with_device_client(BACK_COMPAT_HANDLE handle, DEVICE_CREATION_TYPE create_type, MESSAGE_CREATION_MECHANISM msg_type, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    int result;
    BACK_COMPAT_MSG_CTX bc_msg_ctx = { 0 };
    IOTHUB_DEVICE_CLIENT_LL_HANDLE device_client = create_device_client(handle, create_type, protocol);
    if (device_client == NULL)
    {
        LogError("Failure creating davice client");
        result = __LINE__;
    }
    else
    {
        if (!check_iothub_result(IoTHubDeviceClient_LL_SetConnectionStatusCallback(device_client, connection_status_callback, &bc_msg_ctx)))
        {
            LogError("Failure setting connection status callback");
            result = __LINE__;
        }
        else if (send_telemetry_message(device_client, msg_type, &bc_msg_ctx) != 0)
        {
            LogError("Failure sending telemetry message");
            result = __LINE__;
        }
        else
        {
            tickcounter_ms_t start_time;
            (void)tickcounter_get_current_ms(handle->tick_cntr_handle, &start_time);
            result = 0;
            do
            {
                IoTHubDeviceClient_LL_DoWork(device_client);
            } while (!bc_msg_ctx.callback_recv && !is_operation_timed_out(handle->tick_cntr_handle, start_time, MAX_OPERATION_TIMEOUT));
        }
        IoTHubDeviceClient_LL_Destroy(device_client);
        if (handle->transport_handle != NULL)
        {
            IoTHubTransport_Destroy(handle->transport_handle);
        }
    }
    return 0;
}